

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O3

void proto2_nofieldpresence_unittest::TestAllMapTypes::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *dest;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *dest_00;
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *dest_01;
  Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage> *dest_02;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  dest = google::protobuf::internal::
         TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::MutableMap((TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(to_msg + 1));
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)(from_msg + 1))
  ;
  google::protobuf::internal::MapMergeFrom<int,std::__cxx11::string>
            (dest,(Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(from_msg + 2));
  dest_00 = google::protobuf::internal::
            TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::MutableMap
                      ((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum> *
                       )(to_msg + 4));
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)(from_msg + 4))
  ;
  google::protobuf::internal::MapMergeFrom<int,proto2_nofieldpresence_unittest::ForeignEnum>
            (dest_00,(Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)(from_msg + 5));
  dest_01 = google::protobuf::internal::
            TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>::
            MutableMap((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                        *)(to_msg + 7));
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)(from_msg + 7))
  ;
  google::protobuf::internal::MapMergeFrom<int,proto2_nofieldpresence_unittest::ForeignMessage>
            (dest_01,(Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *)(from_msg + 8));
  dest_02 = google::protobuf::internal::
            TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>::
            MutableMap((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                        *)(to_msg + 10));
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)(from_msg + 10));
  google::protobuf::internal::
  MapMergeFrom<int,proto2_nofieldpresence_unittest::ExplicitForeignMessage>
            (dest_02,(Map<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage> *)
                     (from_msg + 0xb));
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestAllMapTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllMapTypes*>(&to_msg);
  auto& from = static_cast<const TestAllMapTypes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_int32_bytes_.MergeFrom(from._impl_.map_int32_bytes_);
  _this->_impl_.map_int32_foreign_enum_.MergeFrom(from._impl_.map_int32_foreign_enum_);
  _this->_impl_.map_int32_foreign_message_.MergeFrom(from._impl_.map_int32_foreign_message_);
  _this->_impl_.map_int32_explicit_foreign_message_.MergeFrom(from._impl_.map_int32_explicit_foreign_message_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}